

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.cpp
# Opt level: O0

RegressionTest * embree::getRegressionTest(size_t index)

{
  vector<embree::RegressionTest_*,_std::allocator<embree::RegressionTest_*>_> *pvVar1;
  size_type sVar2;
  reference ppRVar3;
  ulong in_RDI;
  undefined8 local_8;
  
  pvVar1 = get_regression_tests();
  sVar2 = std::vector<embree::RegressionTest_*,_std::allocator<embree::RegressionTest_*>_>::size
                    (pvVar1);
  if (in_RDI < sVar2) {
    pvVar1 = get_regression_tests();
    ppRVar3 = std::vector<embree::RegressionTest_*,_std::allocator<embree::RegressionTest_*>_>::
              operator[](pvVar1,in_RDI);
    local_8 = *ppRVar3;
  }
  else {
    local_8 = (value_type)0x0;
  }
  return local_8;
}

Assistant:

RegressionTest* getRegressionTest(size_t index)
  {
    if (index >= get_regression_tests().size())
      return nullptr;
    
    return get_regression_tests()[index];
  }